

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  byte *pbVar1;
  uint32_t r;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *useDefaultScalingMatrixFlag;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int (*paiVar9) [16];
  byte *pbVar10;
  int (*scalingList) [16];
  int iVar11;
  int i_group;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int (*paiVar16) [16];
  int *piVar17;
  bool bVar18;
  
  __s = h->pps;
  iVar7 = 0;
  memset(__s,0,0x87c);
  pbVar10 = b->p;
  pbVar1 = b->end;
  uVar5 = b->bits_left;
  uVar2 = 0xffffffff;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar10 < pbVar1));
  iVar11 = 0;
  if (iVar7 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar7;
    iVar12 = -3 - iVar7;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar10 < pbVar1) {
        uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar12 != -2);
  }
  uVar3 = 0xffffffff;
  __s->pic_parameter_set_id = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar2;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar10 < pbVar1));
  uVar2 = 0;
  if (iVar11 == -1) {
    uVar3 = 0;
  }
  else {
    iVar7 = -2 - iVar11;
    iVar4 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar10 < pbVar1) {
        uVar13 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar13 << ((byte)iVar7 & 0x1f);
      iVar4 = iVar4 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar4 != -2);
  }
  __s->seq_parameter_set_id = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar3;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    uVar5 = 8;
  }
  __s->entropy_coding_mode_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    uVar5 = 8;
  }
  __s->pic_order_present_flag = uVar2;
  uVar2 = 0xffffffff;
  iVar7 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar10 < pbVar1));
  if (iVar7 == -1) {
    uVar2 = 0;
  }
  else {
    iVar11 = -2 - iVar7;
    iVar4 = -3 - iVar7;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar10 < pbVar1) {
        uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar11 & 0x1f);
      iVar4 = iVar4 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar4 != -2);
  }
  uVar3 = 0xffffffff;
  uVar13 = -1 << (~(byte)iVar7 & 0x1f);
  uVar14 = ~uVar13;
  uVar15 = uVar14 + uVar2;
  __s->num_slice_groups_minus1 = uVar15;
  if (uVar15 != 0 && SCARRY4(uVar14,uVar2) == (int)uVar15 < 0) {
    uVar14 = 0xffffffff;
    iVar7 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar10 < pbVar1) {
        bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar14 = uVar14 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar18 & uVar14 < 0x20)) && (pbVar10 < pbVar1));
    if (iVar7 == -1) {
      uVar14 = 0;
    }
    else {
      iVar11 = -2 - iVar7;
      iVar4 = -3 - iVar7;
      uVar14 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar8 = 0;
        if (pbVar10 < pbVar1) {
          uVar8 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar10 = pbVar10 + 1;
          b->p = pbVar10;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar14 = uVar14 | uVar8 << ((byte)iVar11 & 0x1f);
        iVar4 = iVar4 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar4 != -2);
    }
    iVar7 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar14;
    __s->slice_group_map_type = iVar7;
    switch(iVar7) {
    case 0:
      uVar6 = 0;
      do {
        uVar5 = b->bits_left;
        uVar2 = 0xffffffff;
        iVar7 = -2;
        do {
          iVar11 = iVar7;
          uVar13 = uVar2;
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          bVar18 = true;
          if (pbVar10 < pbVar1) {
            bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
          }
          if (uVar5 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar2 = uVar13 + 1;
        } while (((bool)(bVar18 & uVar2 < 0x20)) && (iVar7 = iVar11 + 1, pbVar10 < pbVar1));
        uVar14 = 0;
        if (uVar2 != 0) {
          do {
            uVar5 = uVar5 - 1;
            b->bits_left = uVar5;
            uVar8 = 0;
            if (pbVar10 < pbVar1) {
              uVar8 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
            }
            if (uVar5 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar5 = 8;
            }
            uVar14 = uVar14 | uVar8 << ((byte)uVar13 & 0x1f);
            uVar13 = uVar13 - 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != -2);
        }
        __s->run_length_minus1[uVar6] = ~(-1 << ((byte)uVar2 & 0x1f)) + uVar14;
        bVar18 = uVar6 < uVar15;
        uVar6 = uVar6 + 1;
      } while (bVar18);
      break;
    case 2:
      uVar6 = 0;
      do {
        uVar2 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar7 = -2;
        do {
          iVar11 = iVar7;
          uVar13 = uVar5;
          uVar2 = uVar2 - 1;
          b->bits_left = uVar2;
          bVar18 = true;
          if (pbVar10 < pbVar1) {
            bVar18 = (*pbVar10 >> (uVar2 & 0x1f) & 1) == 0;
          }
          if (uVar2 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar2 = 8;
          }
          uVar5 = uVar13 + 1;
        } while (((bool)(bVar18 & uVar5 < 0x20)) && (iVar7 = iVar11 + 1, pbVar10 < pbVar1));
        uVar14 = 0;
        if (uVar5 != 0) {
          do {
            uVar2 = uVar2 - 1;
            b->bits_left = uVar2;
            uVar8 = 0;
            if (pbVar10 < pbVar1) {
              uVar8 = (uint)((*pbVar10 >> (uVar2 & 0x1f) & 1) != 0);
            }
            if (uVar2 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar2 = 8;
            }
            uVar14 = uVar14 | uVar8 << ((byte)uVar13 & 0x1f);
            uVar13 = uVar13 - 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != -2);
        }
        __s->top_left[uVar6] = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar14;
        uVar5 = b->bits_left;
        uVar2 = 0xffffffff;
        iVar7 = -2;
        do {
          iVar11 = iVar7;
          uVar13 = uVar2;
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          bVar18 = true;
          if (pbVar10 < pbVar1) {
            bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
          }
          if (uVar5 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar2 = uVar13 + 1;
        } while (((bool)(bVar18 & uVar2 < 0x20)) && (iVar7 = iVar11 + 1, pbVar10 < pbVar1));
        uVar14 = 0;
        if (uVar2 != 0) {
          do {
            uVar5 = uVar5 - 1;
            b->bits_left = uVar5;
            uVar8 = 0;
            if (pbVar10 < pbVar1) {
              uVar8 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
            }
            if (uVar5 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar5 = 8;
            }
            uVar14 = uVar14 | uVar8 << ((byte)uVar13 & 0x1f);
            uVar13 = uVar13 - 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != -2);
        }
        __s->bottom_right[uVar6] = ~(-1 << ((byte)uVar2 & 0x1f)) + uVar14;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar15);
      break;
    case 3:
    case 4:
    case 5:
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar2 = 0;
      if (pbVar10 < pbVar1) {
        uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        uVar5 = 8;
      }
      __s->slice_group_change_direction_flag = uVar2;
      uVar2 = 0xffffffff;
      iVar7 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        bVar18 = true;
        if (pbVar10 < pbVar1) {
          bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
        }
        if (uVar5 == 0) {
          pbVar10 = pbVar10 + 1;
          b->p = pbVar10;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar2 = uVar2 + 1;
        iVar7 = iVar7 + -1;
      } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar10 < pbVar1));
      if (iVar7 == -1) {
        uVar2 = 0;
      }
      else {
        iVar11 = -2 - iVar7;
        iVar4 = -3 - iVar7;
        uVar2 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar13 = 0;
          if (pbVar10 < pbVar1) {
            uVar13 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar2 = uVar2 | uVar13 << ((byte)iVar11 & 0x1f);
          iVar4 = iVar4 + -1;
          iVar11 = iVar11 + -1;
        } while (iVar4 != -2);
      }
      __s->slice_group_change_rate_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar2;
      break;
    case 6:
      uVar14 = 0xffffffff;
      iVar7 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        bVar18 = true;
        if (pbVar10 < pbVar1) {
          bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
        }
        if (uVar5 == 0) {
          pbVar10 = pbVar10 + 1;
          b->p = pbVar10;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar14 = uVar14 + 1;
        iVar7 = iVar7 + -1;
      } while (((bool)(bVar18 & uVar14 < 0x20)) && (pbVar10 < pbVar1));
      if (iVar7 == -1) {
        uVar14 = 0;
      }
      else {
        iVar11 = -2 - iVar7;
        iVar4 = -3 - iVar7;
        uVar14 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar15 = 0;
          if (pbVar10 < pbVar1) {
            uVar15 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar14 = uVar14 | uVar15 << ((byte)iVar11 & 0x1f);
          iVar4 = iVar4 + -1;
          iVar11 = iVar11 + -1;
        } while (iVar4 != -2);
      }
      uVar14 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar14;
      __s->pic_size_in_map_units_minus1 = uVar14;
      if (-1 < (int)uVar14) {
        uVar2 = uVar2 - uVar13;
        uVar6 = 0;
        do {
          uVar5 = 0xffffffff;
          do {
            uVar13 = uVar5;
            uVar5 = uVar13 + 1;
          } while (uVar2 >> ((byte)uVar5 & 0x1f) != 0);
          if (uVar2 != 1 << ((byte)uVar5 - 1 & 0x1f)) {
            uVar13 = uVar5;
          }
          uVar15 = 0;
          if (uVar5 == 0) {
            uVar13 = uVar15;
          }
          if (0 < (int)uVar13) {
            uVar5 = b->bits_left;
            uVar15 = 0;
            do {
              uVar13 = uVar13 - 1;
              uVar5 = uVar5 - 1;
              b->bits_left = uVar5;
              uVar8 = 0;
              if (pbVar10 < pbVar1) {
                uVar8 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
              }
              if (uVar5 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar5 = 8;
              }
              uVar15 = uVar15 | uVar8 << ((byte)uVar13 & 0x1f);
            } while (uVar13 != 0);
          }
          __s->slice_group_id[uVar6] = uVar15;
          bVar18 = uVar6 < uVar14;
          uVar6 = uVar6 + 1;
        } while (bVar18);
      }
    }
  }
  uVar5 = b->bits_left;
  iVar7 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar10 < pbVar1));
  iVar11 = 0;
  if (iVar7 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar7;
    iVar12 = -3 - iVar7;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar10 < pbVar1) {
        uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar12 != -2);
  }
  uVar3 = 0xffffffff;
  __s->num_ref_idx_l0_active_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar2;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar10 < pbVar1));
  uVar2 = 0;
  if (iVar11 == -1) {
    uVar3 = 0;
  }
  else {
    iVar7 = -2 - iVar11;
    iVar4 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar10 < pbVar1) {
        uVar13 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar13 << ((byte)iVar7 & 0x1f);
      iVar4 = iVar4 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar4 != -2);
  }
  __s->num_ref_idx_l1_active_minus1 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar3;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    uVar5 = 8;
  }
  __s->weighted_pred_flag = uVar2;
  uVar2 = 0;
  iVar7 = 1;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar3 = 0;
    if (pbVar10 < pbVar1) {
      uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 | uVar3 << ((byte)iVar7 & 0x1f);
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s->weighted_bipred_idc = uVar2;
  pbVar10 = b->p;
  uVar2 = 0xffffffff;
  iVar7 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar10 < pbVar1));
  iVar11 = 0;
  if (iVar7 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar7;
    iVar12 = -3 - iVar7;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar10 < pbVar1) {
        uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar12 != -2);
  }
  uVar13 = 0xffffffff;
  uVar14 = -1 << (~(byte)iVar7 & 0x1f);
  uVar3 = ~uVar14 + uVar2;
  iVar7 = -((int)uVar3 >> 1);
  if ((uVar3 & 1) != 0) {
    iVar7 = (int)(uVar2 - uVar14) >> 1;
  }
  __s->pic_init_qp_minus26 = iVar7;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar13 = uVar13 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar18 & uVar13 < 0x20)) && (pbVar10 < pbVar1));
  iVar7 = 0;
  if (iVar11 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar11;
    iVar12 = -3 - iVar11;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar10 < pbVar1) {
        uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar3 << ((byte)iVar4 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar12 != -2);
  }
  uVar13 = 0xffffffff;
  uVar14 = -1 << (~(byte)iVar11 & 0x1f);
  uVar3 = ~uVar14 + uVar2;
  iVar11 = -((int)uVar3 >> 1);
  if ((uVar3 & 1) != 0) {
    iVar11 = (int)(uVar2 - uVar14) >> 1;
  }
  __s->pic_init_qs_minus26 = iVar11;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar10 < pbVar1) {
      bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar13 = uVar13 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar13 < 0x20)) && (pbVar10 < pbVar1));
  uVar2 = 0;
  if (iVar7 == -1) {
    uVar3 = 0;
  }
  else {
    iVar11 = -2 - iVar7;
    iVar4 = -3 - iVar7;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar10 < pbVar1) {
        uVar13 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar13 << ((byte)iVar11 & 0x1f);
      iVar4 = iVar4 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar4 != -2);
  }
  uVar14 = -1 << (~(byte)iVar7 & 0x1f);
  uVar13 = ~uVar14 + uVar3;
  iVar7 = -((int)uVar13 >> 1);
  if ((uVar13 & 1) != 0) {
    iVar7 = (int)(uVar3 - uVar14) >> 1;
  }
  __s->chroma_qp_index_offset = iVar7;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    uVar5 = 8;
  }
  __s->deblocking_filter_control_present_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    uVar5 = 8;
  }
  __s->constrained_intra_pred_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar10 < pbVar1) {
    uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar10 = pbVar10 + 1;
    b->p = pbVar10;
    b->bits_left = 8;
    uVar5 = 8;
  }
  __s->redundant_pic_cnt_present_flag = uVar2;
  iVar7 = more_rbsp_data(b);
  if (iVar7 != 0) {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar2 = 0;
    if (pbVar10 < pbVar1) {
      uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      uVar5 = 8;
    }
    __s->transform_8x8_mode_flag = uVar2;
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar2 = 0;
    if (pbVar10 < pbVar1) {
      uVar2 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
      uVar5 = 8;
    }
    __s->pic_scaling_matrix_present_flag = uVar2;
    if (uVar2 != 0) {
      paiVar16 = __s->ScalingList4x4;
      piVar17 = __s->ScalingList8x8[1] + 0x3a;
      paiVar9 = (int (*) [16])(__s->bottom_right + 6);
      uVar6 = 0xffffffffffffffff;
      do {
        uVar2 = b->bits_left - 1;
        b->bits_left = uVar2;
        pbVar10 = b->p;
        uVar5 = 0;
        if (pbVar10 < b->end) {
          uVar5 = (uint)((*pbVar10 >> (uVar2 & 0x1f) & 1) != 0);
        }
        if (uVar2 == 0) {
          b->p = pbVar10 + 1;
          b->bits_left = 8;
        }
        uVar6 = uVar6 + 1;
        piVar17[-0xe8] = uVar5;
        if (uVar5 != 0) {
          if (uVar6 < 6) {
            iVar7 = 0x10;
            useDefaultScalingMatrixFlag = piVar17 + -0x80;
            scalingList = paiVar16;
          }
          else {
            iVar7 = 0x40;
            useDefaultScalingMatrixFlag = piVar17;
            scalingList = paiVar9;
          }
          read_scaling_list(b,*scalingList,iVar7,useDefaultScalingMatrixFlag);
        }
        piVar17 = piVar17 + 1;
        paiVar16 = paiVar16 + 1;
        paiVar9 = paiVar9 + 4;
      } while ((long)uVar6 < (long)__s->transform_8x8_mode_flag * 2 + 5);
      uVar5 = b->bits_left;
      pbVar10 = b->p;
    }
    pbVar1 = b->end;
    uVar2 = 0xffffffff;
    iVar7 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar10 < pbVar1) {
        bVar18 = (*pbVar10 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar10 = pbVar10 + 1;
        b->p = pbVar10;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar10 < pbVar1));
    if (iVar7 == -1) {
      uVar2 = 0;
    }
    else {
      iVar11 = -2 - iVar7;
      iVar4 = -3 - iVar7;
      uVar2 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar3 = 0;
        if (pbVar10 < pbVar1) {
          uVar3 = (uint)((*pbVar10 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar10 = pbVar10 + 1;
          b->p = pbVar10;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar2 = uVar2 | uVar3 << ((byte)iVar11 & 0x1f);
        iVar4 = iVar4 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar4 != -2);
    }
    uVar3 = -1 << (~(byte)iVar7 & 0x1f);
    uVar5 = ~uVar3 + uVar2;
    iVar7 = -((int)uVar5 >> 1);
    if ((uVar5 & 1) != 0) {
      iVar7 = (int)(uVar2 - uVar3) >> 1;
    }
    __s->second_chroma_qp_index_offset = iVar7;
  }
  memcpy(h->pps_table[__s->pic_parameter_set_id],h->pps,0x87c);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 1 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    pps->pic_parameter_set_id = bs_read_ue(b);
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);
    pps->pic_order_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                pps->slice_group_id[ i ] = bs_read_u(b, v);
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b, 2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    int have_more_data = 0;
    if( 1 ) { have_more_data = more_rbsp_data(b); }
    if( 0 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }

    if( 1 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}